

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

MemoryRegion * __thiscall MT32Emu::Synth::findMemoryRegion(Synth *this,Bit32u addr)

{
  MemoryRegion *pMVar1;
  MemoryRegion **ppMVar2;
  MemoryRegion *regions [9];
  
  pMVar1 = &this->patchTempMemoryRegion->super_MemoryRegion;
  ppMVar2 = regions;
  regions[1] = &this->rhythmTempMemoryRegion->super_MemoryRegion;
  regions[2] = &this->timbreTempMemoryRegion->super_MemoryRegion;
  regions[3] = &this->patchesMemoryRegion->super_MemoryRegion;
  regions[4] = &this->timbresMemoryRegion->super_MemoryRegion;
  regions[5] = &this->systemMemoryRegion->super_MemoryRegion;
  regions[6] = &this->displayMemoryRegion->super_MemoryRegion;
  regions[7] = &this->resetMemoryRegion->super_MemoryRegion;
  regions[8] = (MemoryRegion *)0x0;
  while ((ppMVar2 = ppMVar2 + 1, pMVar1 != (MemoryRegion *)0x0 &&
         ((addr < pMVar1->startAddr ||
          (pMVar1->entries * pMVar1->entrySize + pMVar1->startAddr <= addr))))) {
    pMVar1 = *ppMVar2;
  }
  return pMVar1;
}

Assistant:

MemoryRegion *Synth::findMemoryRegion(Bit32u addr) {
	MemoryRegion *regions[] = {
		patchTempMemoryRegion,
		rhythmTempMemoryRegion,
		timbreTempMemoryRegion,
		patchesMemoryRegion,
		timbresMemoryRegion,
		systemMemoryRegion,
		displayMemoryRegion,
		resetMemoryRegion,
		NULL
	};
	for (int pos = 0; regions[pos] != NULL; pos++) {
		if (regions[pos]->contains(addr)) {
			return regions[pos];
		}
	}
	return NULL;
}